

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_4::(anonymous_namespace)::Apply<unsigned_short,3>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  uint *puVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  
  iVar7 = k->v1;
  iVar4 = k->v2;
  if (iVar7 != iVar4) {
    fVar2 = k->A;
    do {
      iVar6 = k->rowlen - iVar7;
      iVar5 = iVar6 - k->w2;
      if (iVar5 < k->u1) {
        iVar5 = k->u1;
      }
      iVar6 = iVar6 - k->w1;
      if (k->u2 < iVar6) {
        iVar6 = k->u2;
      }
      if (0 < iVar6 - iVar5) {
        puVar8 = (uint *)((long)data + (long)((k->rowlen * iVar7 + iVar5) * 3) * 2);
        puVar1 = (uint *)((long)puVar8 + (long)((iVar6 - iVar5) * 3) * 2);
        fVar11 = (float)iVar5 - k->u;
        fVar10 = (float)iVar7 - k->v;
        fVar12 = fVar11 * k->A * fVar11 + (k->B * fVar11 + k->C * fVar10) * fVar10;
        fVar10 = (fVar11 + fVar11 + 1.0) * k->A + fVar10 * k->B;
        do {
          if (fVar12 < 1.0) {
            fVar11 = expf(fVar12 * -6.125);
            fVar11 = fVar11 * k->wscale;
            k->weight = k->weight + fVar11;
            uVar3 = *puVar8;
            auVar9._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
            auVar9._4_2_ = (short)(uVar3 >> 0x10);
            auVar9._0_4_ = uVar3;
            *(ulong *)result =
                 CONCAT44(fVar11 * (float)auVar9._4_4_ +
                          (float)((ulong)*(undefined8 *)result >> 0x20),
                          fVar11 * (float)(uVar3 & 0xffff) + (float)*(undefined8 *)result);
            result[2] = (float)(ushort)puVar8[1] * fVar11 + result[2];
          }
          fVar12 = fVar12 + fVar10;
          fVar10 = fVar10 + fVar2 + fVar2;
          puVar8 = (uint *)((long)puVar8 + 6);
        } while (puVar8 < puVar1);
        iVar4 = k->v2;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar4);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }